

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GLSL420Pack::ImplicitConversionsInvalidTest::prepareNextTestCase
          (ImplicitConversionsInvalidTest *this,GLuint test_case_index)

{
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar1;
  GLchar *local_1c0;
  GLchar *local_1b8 [3];
  MessageBuilder local_1a0;
  GLuint local_1c;
  ImplicitConversionsInvalidTest *pIStack_18;
  GLuint test_case_index_local;
  ImplicitConversionsInvalidTest *this_local;
  
  this->m_current_test_case_index = test_case_index;
  if (test_case_index == 0xffffffff) {
    this_local._7_1_ = false;
  }
  else if (test_case_index < 4) {
    local_1c = test_case_index;
    pIStack_18 = this;
    this_00 = deqp::Context::getTestContext(*(Context **)&this->field_0x70);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1a0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [4])"T1:");
    local_1b8[0] = Utils::getTypeName(UINT,1,local_1c + 1);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1b8);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [5])" T2:");
    local_1c0 = Utils::getTypeName(INT,1,local_1c + 1);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_1c0);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ImplicitConversionsInvalidTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	m_current_test_case_index = test_case_index;

	if ((glw::GLuint)-1 == test_case_index)
	{
		return false;
	}
	else if (4 <= test_case_index)
	{
		return false;
	}

	m_context.getTestContext().getLog() << tcu::TestLog::Message
										<< "T1:" << Utils::getTypeName(Utils::UINT, 1, test_case_index + 1)
										<< " T2:" << Utils::getTypeName(Utils::INT, 1, test_case_index + 1)
										<< tcu::TestLog::EndMessage;

	return true;
}